

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

SharedTyPtr __thiscall mir::inst::Variable::type(Variable *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  element_type *in_RDI;
  SharedTyPtr SVar2;
  shared_ptr<mir::types::PtrTy> *in_stack_ffffffffffffff98;
  shared_ptr<mir::types::Ty> *in_stack_ffffffffffffffa0;
  shared_ptr<mir::types::Ty> *this_00;
  shared_ptr<mir::types::Ty> local_30 [3];
  
  if ((*(byte *)(in_RSI + 0x18) & 1) == 0) {
    std::shared_ptr<mir::types::Ty>::shared_ptr
              (in_stack_ffffffffffffffa0,(shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffff98);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    this_00 = local_30;
    std::shared_ptr<mir::types::Ty>::shared_ptr
              (this_00,(shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffff98);
    types::new_ptr_ty((SharedTyPtr *)in_stack_ffffffffffffff98);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
              (this_00,in_stack_ffffffffffffff98);
    std::shared_ptr<mir::types::PtrTy>::~shared_ptr((shared_ptr<mir::types::PtrTy> *)0x2bf28d);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2bf297);
    _Var1._M_pi = extraout_RDX;
  }
  SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedTyPtr)SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

types::SharedTyPtr type() const {
    if (is_memory_var) {
      return types::new_ptr_ty(ty);
    } else {
      return ty;
    }
  }